

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence_test.cpp
# Opt level: O1

void __thiscall
jhu::thrax::SentenceTests_AlignedSentencePairSpan_Test::~SentenceTests_AlignedSentencePairSpan_Test
          (SentenceTests_AlignedSentencePairSpan_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SentenceTests, AlignedSentencePairSpan) {
  std::string_view line = "foo bar baz\tqux\t0-0 1-0 2-0";
  auto pair = readAlignedSentencePair<false, false>(line);
  auto sp = pair.span();
  EXPECT_EQ(0, sp.src.start);
  EXPECT_EQ(3, sp.src.end);
  EXPECT_EQ(0, sp.tgt.start);
  EXPECT_EQ(1, sp.tgt.end);
}